

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O2

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  void *pvVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  int k;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int class_index;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int j;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar29;
  float fVar30;
  float fVar31;
  value_type local_b0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  double dStack_70;
  float local_68;
  float local_58;
  float local_48;
  
  if (in_pad->h < in_pad->w) {
    uVar9 = in_pad->w / stride;
    uVar15 = feat_blob->h / (int)uVar9;
  }
  else {
    uVar15 = in_pad->h / stride;
    uVar9 = feat_blob->h / (int)uVar15;
  }
  uVar21 = feat_blob->w - 5;
  local_98 = (float)stride;
  uVar8 = (long)anchors->w / 2;
  uVar10 = 0;
  uVar22 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar22 = uVar10;
  }
  uVar14 = 0;
  if (0 < (int)uVar9) {
    uVar14 = (ulong)uVar9;
  }
  uVar16 = (ulong)uVar15;
  if ((int)uVar15 < 1) {
    uVar16 = uVar10;
  }
  fStack_94 = local_98;
  fStack_90 = local_98;
  fStack_8c = local_98;
  uVar6 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar6 = uVar10;
  }
  for (; uVar10 != uVar6; uVar10 = uVar10 + 1) {
    pvVar2 = feat_blob->data;
    sVar3 = feat_blob->elemsize;
    lVar18 = feat_blob->cstep * uVar10 * sVar3;
    lVar17 = (long)feat_blob->w * sVar3;
    uVar1 = *(undefined8 *)((long)anchors->data + uVar10 * 8);
    dVar4 = (double)(float)uVar1;
    uVar27 = (undefined4)((ulong)dVar4 >> 0x20);
    dVar5 = (double)(float)((ulong)uVar1 >> 0x20);
    local_88._8_4_ = SUB84(dVar5,0);
    local_88._0_8_ = dVar4;
    local_88._12_4_ = (int)((ulong)dVar5 >> 0x20);
    lVar11 = (long)pvVar2 + feat_blob->cstep * sVar3 * uVar10 + 0x14;
    for (uVar8 = 0; uVar8 != uVar16; uVar8 = uVar8 + 1) {
      local_78 = (float)(int)uVar8;
      lVar12 = lVar11;
      uStack_74 = uVar27;
      dStack_70 = dVar5;
      for (uVar20 = 0; uVar20 != uVar14; uVar20 = uVar20 + 1) {
        lVar19 = (uVar20 + uVar8 * (long)(int)uVar9) * lVar17;
        fVar23 = sigmoid(*(float *)((long)pvVar2 + lVar19 + lVar18 + 0x10));
        uVar27 = extraout_XMM0_Db;
        uVar28 = extraout_XMM0_Dc;
        uVar29 = extraout_XMM0_Dd;
        if (0.25 <= fVar23) {
          fVar24 = -3.4028235e+38;
          uVar13 = 0;
          for (uVar7 = 0; uVar22 != uVar7; uVar7 = uVar7 + 1) {
            fVar25 = *(float *)(lVar12 + uVar7 * 4);
            if (fVar24 < fVar25) {
              uVar13 = uVar7 & 0xffffffff;
              fVar24 = fVar25;
            }
          }
          fVar24 = sigmoid(fVar24);
          uVar27 = extraout_XMM0_Db_00;
          uVar28 = extraout_XMM0_Dc_00;
          uVar29 = extraout_XMM0_Dd_00;
          if (0.25 <= fVar23 * fVar24) {
            local_48 = sigmoid(*(float *)((long)pvVar2 + lVar19 + lVar18));
            local_58 = sigmoid(*(float *)((long)pvVar2 + lVar19 + lVar18 + 4));
            local_68 = sigmoid(*(float *)((long)pvVar2 + lVar19 + lVar18 + 8));
            fVar25 = sigmoid(*(float *)((long)pvVar2 + lVar19 + lVar18 + 0xc));
            fVar30 = (local_48 + local_48 + -0.5 + (float)(int)uVar20) * local_98;
            fVar31 = (local_58 + local_58 + -0.5 + local_78) * fStack_94;
            fVar26 = (float)((double)(local_68 + local_68) * (double)(local_68 + local_68) *
                            (double)local_88._0_8_) * 0.5;
            fVar25 = (float)((double)(fVar25 + fVar25) * (double)(fVar25 + fVar25) *
                            (double)local_88._8_8_) * 0.5;
            local_b0.rect.x = fVar30 - fVar26;
            local_b0.rect.y = fVar31 - fVar25;
            local_b0.rect.width = (fVar26 + fVar30) - local_b0.rect.x;
            local_b0.rect.height = (fVar25 + fVar31) - local_b0.rect.y;
            local_b0.label = (int)uVar13;
            local_b0.prob = fVar23 * fVar24;
            std::vector<Object,_std::allocator<Object>_>::push_back(objects,&local_b0);
            uVar27 = extraout_XMM0_Db_01;
            uVar28 = extraout_XMM0_Dc_01;
            uVar29 = extraout_XMM0_Dd_01;
          }
        }
        dVar5 = (double)CONCAT44(uVar29,uVar28);
        lVar12 = lVar12 + lVar17;
      }
      lVar11 = lVar11 + lVar17 * (int)uVar9;
    }
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = feat_blob.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = feat_blob.w - 5;

    const int num_anchors = anchors.w / 2;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        const ncnn::Mat feat = feat_blob.channel(q);

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                const float* featptr = feat.row(i * num_grid_x + j);
                float box_confidence = sigmoid(featptr[4]);
                if (box_confidence >= prob_threshold)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int k = 0; k < num_class; k++)
                    {
                        float score = featptr[5 + k];
                        if (score > class_score)
                        {
                            class_index = k;
                            class_score = score;
                        }
                    }
                    float confidence = box_confidence * sigmoid(class_score);
                    if (confidence >= prob_threshold)
                    {
                        // yolov5/models/yolo.py Detect forward
                        // y = x[i].sigmoid()
                        // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                        // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                        float dx = sigmoid(featptr[0]);
                        float dy = sigmoid(featptr[1]);
                        float dw = sigmoid(featptr[2]);
                        float dh = sigmoid(featptr[3]);

                        float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                        float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                        float pb_w = pow(dw * 2.f, 2) * anchor_w;
                        float pb_h = pow(dh * 2.f, 2) * anchor_h;

                        float x0 = pb_cx - pb_w * 0.5f;
                        float y0 = pb_cy - pb_h * 0.5f;
                        float x1 = pb_cx + pb_w * 0.5f;
                        float y1 = pb_cy + pb_h * 0.5f;

                        Object obj;
                        obj.rect.x = x0;
                        obj.rect.y = y0;
                        obj.rect.width = x1 - x0;
                        obj.rect.height = y1 - y0;
                        obj.label = class_index;
                        obj.prob = confidence;

                        objects.push_back(obj);
                    }
                }
            }
        }
    }
}